

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<int>::Decompose_Cholesky(TPZMatrix<int> *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  __type_conflict _Var8;
  int tmp2;
  int sum_1;
  int64_t k_1;
  int64_t j;
  int tmp;
  int sum;
  int64_t k;
  int64_t i;
  int64_t dim;
  char *in_stack_00000138;
  char *in_stack_00000140;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  long local_18;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_00000140,in_stack_00000138);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar6 = TPZBaseMatrix::Rows(in_RDI);
    iVar7 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar6 != iVar7) {
      Error(in_stack_00000140,in_stack_00000138);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_18 = CONCAT44(extraout_var,iVar4);
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
      for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
        local_2c = 0;
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_28);
        iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_28);
        lVar1 = local_20;
        local_2c = iVar4 * iVar5 + local_2c;
        local_30 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        local_30 = local_30 - local_2c;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar1,&local_30);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
      _Var8 = std::sqrt<int>(0);
      local_34 = (int)_Var8;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_20,&local_34);
      local_40 = local_20;
      while (local_40 = local_40 + 1, local_40 < local_18) {
        for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
          local_4c = 0;
          iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_48);
          iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_40,local_48);
          lVar2 = local_20;
          lVar1 = local_40;
          local_4c = iVar4 * iVar5 + local_4c;
          local_50 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_40);
          local_50 = local_50 - local_4c;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,&local_50);
        }
        local_54 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        bVar3 = IsZero(local_54);
        if (bVar3) {
          Error(in_stack_00000140,in_stack_00000138);
        }
        lVar2 = local_20;
        lVar1 = local_40;
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_40);
        local_58 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_20);
        local_58 = iVar4 / local_58;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,&local_58);
        lVar2 = local_20;
        lVar1 = local_40;
        local_5c = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_40);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar2,&local_5c);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}